

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLboolean GVar1;
  int iVar2;
  int iVar3;
  _GLFWwindow *window;
  GLFWwindow *handle;
  char *format;
  _GLFWfbconfig fbconfig;
  _GLFWwndconfig wndconfig;
  _GLFWfbconfig local_a0;
  _GLFWwndconfig local_60;
  
  if (_glfwInitialized == '\0') {
    iVar3 = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (0 < width && 0 < height) {
      iVar3 = 0;
      local_a0.redBits = _glfw.hints.redBits;
      if (_glfw.hints.redBits < 1) {
        local_a0.redBits = iVar3;
      }
      local_a0.greenBits = _glfw.hints.greenBits;
      if (_glfw.hints.greenBits < 1) {
        local_a0.greenBits = iVar3;
      }
      local_a0.blueBits = _glfw.hints.blueBits;
      if (_glfw.hints.blueBits < 1) {
        local_a0.blueBits = iVar3;
      }
      local_a0.alphaBits = _glfw.hints.alphaBits;
      if (_glfw.hints.alphaBits < 1) {
        local_a0.alphaBits = iVar3;
      }
      local_a0.depthBits = _glfw.hints.depthBits;
      if (_glfw.hints.depthBits < 1) {
        local_a0.depthBits = iVar3;
      }
      local_a0.stencilBits = _glfw.hints.stencilBits;
      if (_glfw.hints.stencilBits < 1) {
        local_a0.stencilBits = iVar3;
      }
      iVar2 = 0;
      local_a0.accumRedBits = _glfw.hints.accumRedBits;
      if (_glfw.hints.accumRedBits < 1) {
        local_a0.accumRedBits = iVar2;
      }
      local_a0.accumGreenBits = _glfw.hints.accumGreenBits;
      if (_glfw.hints.accumGreenBits < 1) {
        local_a0.accumGreenBits = iVar2;
      }
      local_a0.accumBlueBits = _glfw.hints.accumBlueBits;
      if (_glfw.hints.accumBlueBits < 1) {
        local_a0.accumBlueBits = iVar3;
      }
      local_a0.accumAlphaBits = _glfw.hints.accumAlphaBits;
      if (_glfw.hints.accumAlphaBits < 1) {
        local_a0.accumAlphaBits = iVar3;
      }
      local_a0.auxBuffers = _glfw.hints.auxBuffers;
      if (_glfw.hints.auxBuffers < 1) {
        local_a0.auxBuffers = iVar3;
      }
      local_a0.stereo = _glfw.hints.stereo != '\0';
      local_a0.samples = _glfw.hints.samples;
      if (_glfw.hints.samples < 1) {
        local_a0.samples = iVar2;
      }
      local_a0.sRGB = _glfw.hints.sRGB != '\0';
      local_60.visible = _glfw.hints.visible != '\0';
      local_60.resizable = _glfw.hints.resizable != '\0';
      local_60.decorated = _glfw.hints.decorated != '\0';
      local_60.clientAPI = _glfw.hints.clientAPI;
      local_60.glMajor = _glfw.hints.glMajor;
      local_60.glForward = _glfw.hints.glForward != '\0';
      local_60.glMinor = _glfw.hints.glMinor;
      local_60.glDebug = _glfw.hints.glDebug != '\0';
      local_60.glProfile = _glfw.hints.glProfile;
      local_60.glRobustness = _glfw.hints.glRobustness;
      local_60.width = width;
      local_60.height = height;
      local_60.title = title;
      local_60.monitor = (_GLFWmonitor *)monitor;
      local_60.share = (_GLFWwindow *)share;
      GVar1 = _glfwIsValidContextConfig(&local_60);
      if (GVar1 == '\0') {
        return (GLFWwindow *)0x0;
      }
      window = (_GLFWwindow *)calloc(1,0x298);
      window->next = _glfw.windowListHead;
      _glfw.windowListHead = window;
      if (local_60.monitor != (_GLFWmonitor *)0x0) {
        (window->videoMode).width = width;
        (window->videoMode).height = height;
        iVar3 = _glfw.hints.redBits;
        if (_glfw.hints.redBits < 1) {
          iVar3 = 0;
        }
        (window->videoMode).redBits = iVar3;
        iVar3 = _glfw.hints.greenBits;
        if (_glfw.hints.greenBits < 1) {
          iVar3 = 0;
        }
        local_60.resizable = '\x01';
        local_60.visible = '\x01';
        (window->videoMode).greenBits = iVar3;
        iVar3 = _glfw.hints.blueBits;
        if (_glfw.hints.blueBits < 1) {
          iVar3 = 0;
        }
        (window->videoMode).blueBits = iVar3;
        iVar3 = 0;
        if (0 < _glfw.hints.refreshRate) {
          iVar3 = _glfw.hints.refreshRate;
        }
        (window->videoMode).refreshRate = iVar3;
      }
      window->monitor = local_60.monitor;
      window->resizable = local_60.resizable;
      window->decorated = local_60.decorated;
      window->cursorMode = 0x34001;
      handle = glfwGetCurrentContext();
      iVar3 = _glfwPlatformCreateWindow(window,&local_60,&local_a0);
      if (iVar3 != 0) {
        glfwMakeContextCurrent((GLFWwindow *)window);
        GVar1 = _glfwRefreshContextAttribs();
        if ((GVar1 != '\0') && (GVar1 = _glfwIsValidContext(&local_60), GVar1 != '\0')) {
          glClear(0x4000);
          _glfwPlatformSwapBuffers(window);
          glfwMakeContextCurrent(handle);
          if (local_60.monitor != (_GLFWmonitor *)0x0) {
            return (GLFWwindow *)window;
          }
          if (local_60.visible == '\0') {
            return (GLFWwindow *)window;
          }
          glfwShowWindow((GLFWwindow *)window);
          return (GLFWwindow *)window;
        }
      }
      glfwDestroyWindow((GLFWwindow *)window);
      glfwMakeContextCurrent(handle);
      return (GLFWwindow *)0x0;
    }
    format = "Invalid window size";
    iVar3 = 0x10004;
  }
  _glfwInputError(iVar3,format);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid window size");
        return NULL;
    }

    // Set up desired framebuffer config
    fbconfig.redBits        = Max(_glfw.hints.redBits, 0);
    fbconfig.greenBits      = Max(_glfw.hints.greenBits, 0);
    fbconfig.blueBits       = Max(_glfw.hints.blueBits, 0);
    fbconfig.alphaBits      = Max(_glfw.hints.alphaBits, 0);
    fbconfig.depthBits      = Max(_glfw.hints.depthBits, 0);
    fbconfig.stencilBits    = Max(_glfw.hints.stencilBits, 0);
    fbconfig.accumRedBits   = Max(_glfw.hints.accumRedBits, 0);
    fbconfig.accumGreenBits = Max(_glfw.hints.accumGreenBits, 0);
    fbconfig.accumBlueBits  = Max(_glfw.hints.accumBlueBits, 0);
    fbconfig.accumAlphaBits = Max(_glfw.hints.accumAlphaBits, 0);
    fbconfig.auxBuffers     = Max(_glfw.hints.auxBuffers, 0);
    fbconfig.stereo         = _glfw.hints.stereo ? GL_TRUE : GL_FALSE;
    fbconfig.samples        = Max(_glfw.hints.samples, 0);
    fbconfig.sRGB           = _glfw.hints.sRGB ? GL_TRUE : GL_FALSE;

    // Set up desired window config
    wndconfig.width         = width;
    wndconfig.height        = height;
    wndconfig.title         = title;
    wndconfig.resizable     = _glfw.hints.resizable ? GL_TRUE : GL_FALSE;
    wndconfig.visible       = _glfw.hints.visible ? GL_TRUE : GL_FALSE;
    wndconfig.decorated     = _glfw.hints.decorated ? GL_TRUE : GL_FALSE;
    wndconfig.clientAPI     = _glfw.hints.clientAPI;
    wndconfig.glMajor       = _glfw.hints.glMajor;
    wndconfig.glMinor       = _glfw.hints.glMinor;
    wndconfig.glForward     = _glfw.hints.glForward ? GL_TRUE : GL_FALSE;
    wndconfig.glDebug       = _glfw.hints.glDebug ? GL_TRUE : GL_FALSE;
    wndconfig.glProfile     = _glfw.hints.glProfile;
    wndconfig.glRobustness  = _glfw.hints.glRobustness;
    wndconfig.monitor       = (_GLFWmonitor*) monitor;
    wndconfig.share         = (_GLFWwindow*) share;

    // Check the OpenGL bits of the window config
    if (!_glfwIsValidContextConfig(&wndconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    if (wndconfig.monitor)
    {
        wndconfig.resizable = GL_TRUE;
        wndconfig.visible   = GL_TRUE;

        // Set up desired video mode
        window->videoMode.width       = width;
        window->videoMode.height      = height;
        window->videoMode.redBits     = Max(_glfw.hints.redBits, 0);
        window->videoMode.greenBits   = Max(_glfw.hints.greenBits, 0);
        window->videoMode.blueBits    = Max(_glfw.hints.blueBits, 0);
        window->videoMode.refreshRate = Max(_glfw.hints.refreshRate, 0);
    }

    window->monitor    = wndconfig.monitor;
    window->resizable  = wndconfig.resizable;
    window->decorated  = wndconfig.decorated;
    window->cursorMode = GLFW_CURSOR_NORMAL;

    // Save the currently current context so it can be restored later
    previous = (_GLFWwindow*) glfwGetCurrentContext();

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        glfwMakeContextCurrent((GLFWwindow*) previous);
        return NULL;
    }

    glfwMakeContextCurrent((GLFWwindow*) window);

    // Retrieve the actual (as opposed to requested) context attributes
    if (!_glfwRefreshContextAttribs())
    {
        glfwDestroyWindow((GLFWwindow*) window);
        glfwMakeContextCurrent((GLFWwindow*) previous);
        return NULL;
    }

    // Verify the context against the requested parameters
    if (!_glfwIsValidContext(&wndconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        glfwMakeContextCurrent((GLFWwindow*) previous);
        return NULL;
    }

    // Clearing the front buffer to black to avoid garbage pixels left over
    // from previous uses of our bit of VRAM
    glClear(GL_COLOR_BUFFER_BIT);
    _glfwPlatformSwapBuffers(window);

    // Restore the previously current context (or NULL)
    glfwMakeContextCurrent((GLFWwindow*) previous);

    if (wndconfig.monitor == NULL && wndconfig.visible)
        glfwShowWindow((GLFWwindow*) window);

    return (GLFWwindow*) window;
}